

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

bool __thiscall pbrt::Image::WritePNG(Image *this,string *name,ImageMetadata *metadata)

{
  uint8_t uVar1;
  uint uVar2;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var3;
  int x_1;
  Point2i p;
  int iVar4;
  int y;
  ulong uVar5;
  long lVar6;
  int x;
  uint uVar7;
  int textureIndex;
  long lVar8;
  float fVar9;
  Float FVar10;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> rgb8;
  int nOutOfGamut;
  ulong local_50;
  string *local_48;
  WrapMode2D local_40;
  WrapMode2D local_38;
  
  nOutOfGamut = 0;
  iVar4 = (int)(this->channelNames).nStored;
  if (this->format == U256) {
    if (iVar4 == 3) {
      uVar2 = lodepng_encode24_file
                        ((name->_M_dataplus)._M_p,(this->p8).ptr,
                         (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,
                         (this->resolution).super_Tuple2<pbrt::Point2,_int>.y);
    }
    else {
      if (iVar4 != 1) {
        rgb8._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._0_4_ = iVar4;
        LogFatal<int>(Fatal,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
                      ,0x569,"Unhandled channel count in WritePNG(): %d",(int *)&rgb8);
      }
      uVar2 = lodepng_encode_file((name->_M_dataplus)._M_p,(this->p8).ptr,
                                  (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,
                                  (this->resolution).super_Tuple2<pbrt::Point2,_int>.y,LCT_GREY,8);
    }
  }
  else {
    local_48 = name;
    if (iVar4 == 1) {
      uVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      uVar7 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      _Var3.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           operator_new__((long)(int)(uVar2 * uVar7));
      local_50 = 0;
      memset((void *)_Var3.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,
             (long)(int)(uVar2 * uVar7));
      iVar4 = 0;
      rgb8._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           _Var3.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      for (lVar6 = 0; name = local_48, lVar6 < (int)uVar2; lVar6 = lVar6 + 1) {
        for (lVar8 = 0; lVar8 < (int)uVar7; lVar8 = lVar8 + 1) {
          fVar9 = BlueNoise(0,(int)lVar8,(int)lVar6);
          WrapMode2D::WrapMode2D(&local_40,Clamp);
          FVar10 = GetChannel(this,(Point2i)(local_50 + lVar8),0,local_40);
          if ((FVar10 < 0.0) || (1.0 < FVar10)) {
            iVar4 = iVar4 + 1;
            nOutOfGamut = iVar4;
          }
          uVar1 = LinearToSRGB8(FVar10,fVar9 + -0.5);
          *(uint8_t *)
           (lVar8 + (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x * (long)(int)lVar6 +
                    (long)rgb8._M_t.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl) = uVar1;
          uVar7 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
        }
        uVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
        local_50 = local_50 + 0x100000000;
      }
      uVar2 = lodepng_encode_file((local_48->_M_dataplus)._M_p,
                                  (uchar *)rgb8._M_t.
                                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                           .super__Head_base<0UL,_unsigned_char_*,_false>.
                                           _M_head_impl,uVar7,uVar2,LCT_GREY,8);
    }
    else {
      if (iVar4 != 3) {
        return true;
      }
      uVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      uVar7 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      uVar5 = (ulong)(int)(uVar2 * uVar7 * 3);
      _Var3.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           operator_new__(uVar5);
      iVar4 = 0;
      memset((void *)_Var3.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,uVar5);
      rgb8._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           _Var3.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      for (lVar6 = 0; name = local_48, lVar6 < (int)uVar7; lVar6 = lVar6 + 1) {
        local_50 = lVar6 << 0x20;
        for (uVar5 = 0; (long)uVar5 < (long)(int)uVar2; uVar5 = uVar5 + 1) {
          p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_50 | uVar5);
          for (lVar8 = 0; textureIndex = (int)lVar8, textureIndex != 3; lVar8 = lVar8 + 1) {
            fVar9 = BlueNoise(textureIndex,(int)uVar5,(int)lVar6);
            WrapMode2D::WrapMode2D(&local_38,Clamp);
            FVar10 = GetChannel(this,p,textureIndex,local_38);
            if ((FVar10 < 0.0) || (1.0 < FVar10)) {
              iVar4 = iVar4 + 1;
              nOutOfGamut = iVar4;
            }
            uVar1 = LinearToSRGB8(FVar10,fVar9 + -0.5);
            *(uint8_t *)
             (lVar8 + (long)((this->resolution).super_Tuple2<pbrt::Point2,_int>.x * (int)lVar6 +
                            (int)uVar5) * 3 +
                      (long)rgb8._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl) = uVar1;
          }
          uVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
        }
        uVar7 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      }
      uVar2 = lodepng_encode24_file
                        ((local_48->_M_dataplus)._M_p,
                         (uchar *)rgb8._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,uVar2,
                         uVar7);
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&rgb8);
    if (0 < iVar4) {
      Warning<std::__cxx11::string_const&,int&>
                ("%s: %d out of gamut pixel channels clamped to [0,1].",name,&nOutOfGamut);
    }
  }
  if (uVar2 != 0) {
    rgb8._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         lodepng_error_text(uVar2);
    Error<std::__cxx11::string_const&,char_const*>
              ("Error writing PNG \"%s\": %s",name,(char **)&rgb8);
  }
  return uVar2 == 0;
}

Assistant:

bool Image::WritePNG(const std::string &name, const ImageMetadata &metadata) const {
    unsigned int error = 0;
    int nOutOfGamut = 0;

    if (format == PixelFormat::U256) {
        if (NChannels() == 1)
            error = lodepng_encode_file(name.c_str(), p8.data(), resolution.x,
                                        resolution.y, LCT_GREY, 8 /* bitdepth */);
        else if (NChannels() == 3)
            // TODO: it would be nice to store the color encoding used in the
            // PNG metadata...
            error = lodepng_encode24_file(name.c_str(), p8.data(), resolution.x,
                                          resolution.y);
        else
            LOG_FATAL("Unhandled channel count in WritePNG(): %d", NChannels());
    } else if (NChannels() == 3) {
        // It may not actually be RGB, but that's what PNG's going to
        // assume..
        std::unique_ptr<uint8_t[]> rgb8 =
            std::make_unique<uint8_t[]>(3 * resolution.x * resolution.y);
        for (int y = 0; y < resolution.y; ++y)
            for (int x = 0; x < resolution.x; ++x)
                for (int c = 0; c < 3; ++c) {
                    Float dither = -.5f + BlueNoise(c, x, y);
                    Float v = GetChannel({x, y}, c);
                    if (v < 0 || v > 1)
                        ++nOutOfGamut;
                    rgb8[3 * (y * resolution.x + x) + c] = LinearToSRGB8(v, dither);
                }

        error =
            lodepng_encode24_file(name.c_str(), rgb8.get(), resolution.x, resolution.y);
    } else if (NChannels() == 1) {
        std::unique_ptr<uint8_t[]> y8 =
            std::make_unique<uint8_t[]>(resolution.x * resolution.y);
        for (int y = 0; y < resolution.y; ++y)
            for (int x = 0; x < resolution.x; ++x) {
                Float dither = -.5f + BlueNoise(0, x, y);
                Float v = GetChannel({x, y}, 0);
                if (v < 0 || v > 1)
                    ++nOutOfGamut;
                y8[y * resolution.x + x] = LinearToSRGB8(v, dither);
            }

        error = lodepng_encode_file(name.c_str(), y8.get(), resolution.x, resolution.y,
                                    LCT_GREY, 8 /* bitdepth */);
    }

    if (nOutOfGamut > 0)
        Warning("%s: %d out of gamut pixel channels clamped to [0,1].", name,
                nOutOfGamut);

    if (error != 0) {
        Error("Error writing PNG \"%s\": %s", name, lodepng_error_text(error));
        return false;
    }
    return true;
}